

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *b)

{
  element_type *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000008;
  int *in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000020;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000028;
  int n;
  int sz;
  int in_stack_00000090;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  type *in_stack_fffffffffffffee0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffee8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffef0;
  undefined1 local_e4 [56];
  int local_ac;
  int local_a8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff60;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff68;
  Real local_88;
  undefined1 local_80 [64];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  undefined8 local_30;
  Real *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_40 = in_RSI;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x34e5ac);
  local_88 = Tolerances::epsilon(this_00);
  local_20 = local_80;
  local_28 = &local_88;
  local_30 = 0;
  local_8 = local_28;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x34e635);
  (**(code **)(**(long **)(in_RDI + 0x508) + 0x18))();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_fffffffffffffee8);
  local_a8 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::size((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x34e67e);
  this_01 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x10);
  local_10 = local_e4;
  local_18 = local_80;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_01,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::altValues(this_01);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::altIndexMem(this_01);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::altValues(this_01);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::altIndexMem(this_01);
  local_ac = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveLeft(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                          in_stack_00000008,unaff_retaddr,in_stack_00000090);
  if (local_ac < 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unSetup(local_40);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setSize(this_01,in_stack_fffffffffffffedc);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::forceSetup(local_40);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setSize(this_01,in_stack_fffffffffffffedc);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::forceSetup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(in_RDI + 0x368));
  *(int *)(in_RDI + 0x514) = *(int *)(in_RDI + 0x514) + 1;
  (**(code **)(**(long **)(in_RDI + 0x508) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{
   R epsilon = this->tolerances()->epsilon();

   solveTime->start();

   // copy to SSVec is done to avoid having to deal with the Nonzero datatype
   // TODO change SVec to standard sparse format
   ssvec.assign(b);

   x.clear();
   int sz = ssvec.size(); // see .altValues()
   int n = this->vSolveLeft(epsilon, x.altValues(), x.altIndexMem(),
                            ssvec.altValues(), ssvec.altIndexMem(), sz);

   if(n > 0)
   {
      x.setSize(n);
      x.forceSetup();
   }
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}